

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

ModuleBase *
soul::StructuralParser::cloneModuleWithNewName
          (Allocator *allocator,Namespace *parentNamespace,ModuleBase *itemToClone,string *newName)

{
  int iVar1;
  Identifier IVar2;
  ModuleBase *pMVar3;
  string_view newString;
  StructuralParser p;
  SourceCodeText *local_110;
  char *local_108;
  undefined1 local_100 [16];
  UTF8Reader local_f0;
  undefined1 local_e8 [16];
  UTF8Reader local_d8;
  undefined1 local_d0 [168];
  
  StructuralParser((StructuralParser *)(local_d0 + 8),allocator,
                   &(itemToClone->super_ASTObject).context.location,
                   &parentNamespace->super_ModuleBase);
  iVar1 = (*(itemToClone->super_ASTObject)._vptr_ASTObject[4])(itemToClone);
  if ((char)iVar1 == '\0') {
    local_d0._0_8_ = (ModuleBase *)0x0;
  }
  else {
    local_e8._8_8_ = (itemToClone->processorKeywordLocation).sourceCode.object;
    if ((SourceCodeText *)local_e8._8_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_e8._8_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_e8._8_8_)->super_RefCountedObject).refCount + 1;
    }
    local_d8.data = (itemToClone->processorKeywordLocation).location.data;
    parseProcessorDecl((StructuralParser *)local_d0,(CodeLocation *)(local_d0 + 8),
                       (Namespace *)(local_e8 + 8));
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_e8._8_8_);
  }
  iVar1 = (*(itemToClone->super_ASTObject)._vptr_ASTObject[5])(itemToClone);
  pMVar3 = (ModuleBase *)local_d0._0_8_;
  if ((char)iVar1 != '\0') {
    local_100._8_8_ = (itemToClone->processorKeywordLocation).sourceCode.object;
    if ((SourceCodeText *)local_100._8_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_100._8_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_100._8_8_)->super_RefCountedObject).refCount + 1;
    }
    local_f0.data = (itemToClone->processorKeywordLocation).location.data;
    parseGraphDecl((StructuralParser *)local_e8,(CodeLocation *)(local_d0 + 8),
                   (Namespace *)(local_100 + 8));
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_100._8_8_);
    pMVar3 = (ModuleBase *)local_e8._0_8_;
  }
  iVar1 = (*(itemToClone->super_ASTObject)._vptr_ASTObject[6])(itemToClone);
  if ((char)iVar1 != '\0') {
    local_110 = (itemToClone->processorKeywordLocation).sourceCode.object;
    if (local_110 != (SourceCodeText *)0x0) {
      (local_110->super_RefCountedObject).refCount =
           (local_110->super_RefCountedObject).refCount + 1;
    }
    local_108 = (itemToClone->processorKeywordLocation).location.data;
    parseNamespaceDecl((StructuralParser *)local_100,(CodeLocation *)(local_d0 + 8),
                       (ModuleBase *)&local_110);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_110);
    pMVar3 = (ModuleBase *)local_100._0_8_;
  }
  if (pMVar3 != (ModuleBase *)0x0) {
    newString._M_str = (newName->_M_dataplus)._M_p;
    newString._M_len = newName->_M_string_length;
    IVar2 = Identifier::Pool::get(&allocator->identifiers,newString);
    (pMVar3->name).name = IVar2.name;
    (pMVar3->originalModule).object = itemToClone;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::~Tokeniser((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  *)(local_d0 + 8));
    return pMVar3;
  }
  throwInternalCompilerError("clonedModule != nullptr","cloneModuleWithNewName",0x109);
}

Assistant:

static AST::ModuleBase& cloneModuleWithNewName (AST::Allocator& allocator,
                                                    AST::Namespace& parentNamespace,
                                                    AST::ModuleBase& itemToClone,
                                                    const std::string& newName)
    {
        StructuralParser p (allocator, itemToClone.context.location, parentNamespace);

        pool_ptr<AST::ModuleBase> clonedModule;

        if (itemToClone.isProcessor())  clonedModule = p.parseProcessorDecl (itemToClone.processorKeywordLocation, parentNamespace);
        if (itemToClone.isGraph())      clonedModule = p.parseGraphDecl     (itemToClone.processorKeywordLocation, parentNamespace);
        if (itemToClone.isNamespace())  clonedModule = p.parseNamespaceDecl (itemToClone.processorKeywordLocation, parentNamespace);

        SOUL_ASSERT (clonedModule != nullptr);

        clonedModule->name = allocator.identifiers.get (newName);
        clonedModule->originalModule = itemToClone;

        return *clonedModule;
    }